

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

x86Reg GenCodeLoadInt64FromPointerIntoRegister(CodeGenRegVmContext *ctx,uchar reg,uint offset)

{
  x86Reg targetReg;
  x86Reg targetReg_3;
  x86Reg targetReg_2;
  x86Reg targetReg_1;
  uint offset_local;
  uchar reg_local;
  CodeGenRegVmContext *ctx_local;
  
  if (reg == '\x03') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,offset,true);
    if (ctx_local._4_4_ == rRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,ctx_local._4_4_,sQWORD,rEBX,offset);
    }
  }
  else if (reg == '\x01') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rR15,offset,true);
    if (ctx_local._4_4_ == rRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,ctx_local._4_4_,sQWORD,rR15,offset);
    }
  }
  else if (reg == '\x02') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rR14,offset,true);
    if (ctx_local._4_4_ == rRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,ctx_local._4_4_,sQWORD,rR14,offset);
    }
  }
  else {
    ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,ctx_local._4_4_,sQWORD,rEBX,(uint)reg << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,ctx_local._4_4_,sQWORD,ctx_local._4_4_,offset);
  }
  return ctx_local._4_4_;
}

Assistant:

x86Reg GenCodeLoadInt64FromPointerIntoRegister(CodeGenRegVmContext &ctx, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rREG, offset); // Load long value

		return targetReg;
	}

	if(reg == rvrrFrame)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rR15, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rR15, offset); // Load long value

		return targetReg;
	}

	if(reg == rvrrConstants)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rR14, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rR14, offset); // Load long value

		return targetReg;
	}

	x86Reg targetReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rREG, reg * 8); // Load source pointer
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, targetReg, offset); // Load long value

	return targetReg;
}